

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O3

void __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::SetState
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this,RESOURCE_STATE State)

{
  string msg;
  string local_38;
  
  if (((State != RESOURCE_STATE_UNKNOWN) && (State != RESOURCE_STATE_BUILD_AS_READ)) &&
     (State != RESOURCE_STATE_BUILD_AS_WRITE)) {
    FormatString<char[60]>
              (&local_38,
               (char (*) [60])"Unsupported state for a bottom-level acceleration structure");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"SetState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
               ,0xa8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_State = State;
  return;
}

Assistant:

SetState(RESOURCE_STATE State) override final
    {
        DEV_CHECK_ERR(State == RESOURCE_STATE_UNKNOWN || State == RESOURCE_STATE_BUILD_AS_READ || State == RESOURCE_STATE_BUILD_AS_WRITE,
                      "Unsupported state for a bottom-level acceleration structure");
        this->m_State = State;
    }